

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cx86_64-ABI-code.c
# Opt level: O1

int target_add_call_res_op
              (c2m_ctx_t c2m_ctx,type *ret_type,target_arg_info_t *arg_info,
              size_t call_arg_area_offset)

{
  undefined8 *puVar1;
  MIR_error_func_t p_Var2;
  VARR_MIR_op_t *pVVar3;
  decl_t pdVar4;
  MIR_context_t pMVar5;
  c2mir_options *pcVar6;
  int64_t iVar7;
  char *pcVar8;
  char *pcVar9;
  undefined8 uVar10;
  MIR_disp_t MVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined8 uVar15;
  uint uVar16;
  MIR_type_t MVar17;
  MIR_reg_t reg;
  int iVar18;
  MIR_type_t MVar19;
  ulong uVar20;
  MIR_op_t *pMVar21;
  MIR_insn_t_conflict insn;
  undefined1 *puVar22;
  void *pvVar23;
  MIR_error_func_t extraout_RAX;
  MIR_type_t MVar24;
  gen_ctx *disp;
  size_t sVar25;
  gen_ctx_conflict *pgVar26;
  c2m_ctx_t ctx;
  c2m_ctx_t c2m_ctx_00;
  ulong uVar27;
  undefined4 uVar28;
  MIR_type_t qword_types [2];
  MIR_type_t aMStack_1f0 [2];
  gen_ctx_conflict *pgStack_1e8;
  MIR_error_func_t p_Stack_1e0;
  undefined8 local_138;
  uint32_t uStack_130;
  MIR_reg_t MStack_12c;
  MIR_alias_t MStack_128;
  MIR_disp_t MStack_124;
  MIR_type_t local_100 [2];
  decl_t local_f8;
  undefined8 uStack_f0;
  decl_t pdStack_e8;
  undefined8 uStack_e0;
  undefined1 local_d8 [32];
  anon_union_32_12_57d33f68_for_u aaStack_b8 [4];
  
  ctx = (c2m_ctx_t)c2m_ctx->ctx;
  pgVar26 = c2m_ctx->gen_ctx;
  if ((ret_type->mode != TM_BASIC) || (uVar16 = 0xffffffff, (ret_type->u).basic_type != TP_VOID)) {
    p_Stack_1e0 = (MIR_error_func_t)0x1aaef7;
    uVar16 = process_ret_type(c2m_ctx,ret_type,local_100);
    if (uVar16 == 0) {
      if ((ret_type->mode & ~TM_BASIC) == TM_STRUCT) {
        arg_info->n_iregs = arg_info->n_iregs + 1;
        p_Stack_1e0 = (MIR_error_func_t)0x1ab079;
        get_new_temp((op_t *)local_d8,c2m_ctx,MIR_T_I64);
        uVar28 = aaStack_b8[0].reg;
        pdStack_e8 = (decl_t)CONCAT44(local_d8._20_4_,local_d8._16_4_);
        uStack_e0._4_4_ = local_d8._28_4_;
        uStack_e0._0_4_ = local_d8._24_4_;
        local_f8 = (decl_t)local_d8._0_8_;
        uStack_f0 = local_d8._8_8_;
        p_Stack_1e0 = (MIR_error_func_t)0x1ab0ce;
        reg = MIR_reg((MIR_context_t)ctx,"fp",(pgVar26->curr_func->u).func);
        p_Stack_1e0 = (MIR_error_func_t)0x1ab0e0;
        MIR_new_reg_op((MIR_context_t)ctx,reg);
        p_Stack_1e0 = (MIR_error_func_t)0x1ab106;
        MIR_new_int_op((MIR_context_t)ctx,call_arg_area_offset);
        local_d8._0_8_ = pdStack_e8;
        local_d8._8_8_ = uStack_e0;
        local_d8._16_4_ = aaStack_b8[0].reg;
        local_d8._20_4_ = aaStack_b8[0].mem.alias;
        local_d8._24_4_ = aaStack_b8[0].mem.nonalias;
        local_d8._28_4_ = aaStack_b8[0].mem.nloc;
        aaStack_b8[0].reg = aaStack_b8[0].mem.base;
        aaStack_b8[0].mem.alias = aaStack_b8[0].mem.index;
        aaStack_b8[0].mem.nonalias = (undefined4)aaStack_b8[0].mem.disp;
        aaStack_b8[0].mem.nloc = (undefined4)((ulong)aaStack_b8[0]._24_8_ >> 0x20);
        p_Stack_1e0 = (MIR_error_func_t)0x1ab194;
        insn = MIR_new_insn(c2m_ctx->ctx,MIR_ADD);
        p_Stack_1e0 = (MIR_error_func_t)0x1ab19f;
        emit_insn_opt(c2m_ctx,insn);
        p_Stack_1e0 = (MIR_error_func_t)0x1ab1aa;
        disp = (gen_ctx *)raw_type_size(c2m_ctx,ret_type);
        uVar27 = (ulong)ret_type->align;
        if (uVar27 != 0) {
          uVar20 = (long)disp->call_used_hard_regs + (uVar27 - 0x69);
          disp = (gen_ctx *)(uVar20 - uVar20 % uVar27);
        }
        uVar16 = 0;
        p_Stack_1e0 = (MIR_error_func_t)0x1ab1f2;
        MIR_new_mem_op((MIR_op_t *)local_d8,(MIR_context_t)ctx,MIR_T_RBLK,(MIR_disp_t)disp,uVar28,0,
                       '\x01');
        pdStack_e8 = (decl_t)local_d8._0_8_;
        uStack_e0 = local_d8._8_8_;
        local_138 = CONCAT44(local_d8._24_4_,local_d8._20_4_);
        uStack_130 = local_d8._28_4_;
        MStack_124 = CONCAT44(aaStack_b8[0].mem.nloc,aaStack_b8[0].mem.nonalias);
        MStack_12c = aaStack_b8[0].reg;
        MStack_128 = aaStack_b8[0].mem.alias;
        pgVar26 = (gen_ctx_conflict *)pgVar26->call_ops;
        c2m_ctx_00 = (c2m_ctx_t)(pgVar26->zero_op).mir_op.data;
        if (c2m_ctx_00 == (c2m_ctx_t)0x0) {
LAB_001ab369:
          p_Stack_1e0 = (MIR_error_func_t)0x1ab36e;
          target_add_call_res_op_cold_3();
          c2m_ctx = ctx;
LAB_001ab36e:
          p_Stack_1e0 = VARR_MIR_op_tlast;
          target_add_call_res_op_cold_2();
          p_Stack_1e0 = extraout_RAX;
          if (((c2m_ctx != (c2m_ctx_t)0x0) &&
              (p_Stack_1e0 = (MIR_error_func_t)c2m_ctx->env[0].__jmpbuf[0],
              p_Stack_1e0 != (MIR_error_func_t)0x0)) &&
             (disp = (gen_ctx *)c2m_ctx->ctx, disp != (gen_ctx *)0x0)) {
            p_Var2 = p_Stack_1e0 + (long)disp * 0x30 + -0x30;
            pMVar5 = *(MIR_context_t *)p_Var2;
            pcVar6 = *(c2mir_options **)(p_Var2 + 8);
            iVar7 = *(int64_t *)(p_Var2 + 0x10);
            pcVar8 = *(char **)(p_Var2 + 0x18);
            p_Var2 = p_Stack_1e0 + (long)disp * 0x30 + -0x20;
            pcVar9 = *(char **)(p_Var2 + 8);
            uVar10 = *(undefined8 *)(p_Var2 + 0x10);
            MVar11 = *(MIR_disp_t *)(p_Var2 + 0x18);
            ((anon_union_32_12_57d33f68_for_u *)c2m_ctx_00->env)->i = *(int64_t *)p_Var2;
            (((anon_union_32_12_57d33f68_for_u *)c2m_ctx_00->env)->str).s = pcVar9;
            *(undefined8 *)((long)c2m_ctx_00->env + 0x10) = uVar10;
            (((anon_union_32_12_57d33f68_for_u *)c2m_ctx_00->env)->mem).disp = MVar11;
            c2m_ctx_00->ctx = pMVar5;
            c2m_ctx_00->options = pcVar6;
            ((anon_union_32_12_57d33f68_for_u *)c2m_ctx_00->env)->i = iVar7;
            (((anon_union_32_12_57d33f68_for_u *)c2m_ctx_00->env)->str).s = pcVar8;
            return (int)c2m_ctx_00;
          }
          iVar18 = (int)disp;
          pgStack_1e8 = (gen_ctx_conflict *)target_get_blk_type;
          VARR_MIR_op_tlast_cold_1();
          pgStack_1e8 = pgVar26;
          iVar18 = classify_arg(c2m_ctx_00,(type *)c2m_ctx,aMStack_1f0,iVar18);
          if ((*(uint *)(c2m_ctx->env[0].__jmpbuf + 1) & 0xfffffffe) != 4) {
            __assert_fail("arg_type->mode == TM_STRUCT || arg_type->mode == TM_UNION",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/x86_64/cx86_64-ABI-code.c"
                          ,0x166,"MIR_type_t target_get_blk_type(c2m_ctx_t, struct type *)");
          }
          MVar19 = get_blk_type(iVar18,aMStack_1f0);
          return MVar19;
        }
        pdVar4 = (pgVar26->zero_op).decl;
        uVar28 = local_d8._16_4_;
      }
      else {
        p_Stack_1e0 = (MIR_error_func_t)0x1ab258;
        MVar17 = get_mir_type(c2m_ctx,ret_type);
        MVar24 = MVar17 & 0x1d;
        disp = (gen_ctx *)(ulong)MVar24;
        MVar19 = MIR_T_U32;
        if (MVar24 != MIR_T_U8) {
          MVar19 = MVar17;
        }
        MVar17 = MIR_T_I32;
        if (MVar24 != MIR_T_I8) {
          MVar17 = MVar19;
        }
        p_Stack_1e0 = (MIR_error_func_t)0x1ab285;
        get_new_temp((op_t *)local_d8,c2m_ctx,MVar17);
        pdStack_e8 = (decl_t)CONCAT44(local_d8._20_4_,local_d8._16_4_);
        uStack_e0._4_4_ = local_d8._28_4_;
        uStack_e0._0_4_ = local_d8._24_4_;
        local_f8 = (decl_t)local_d8._0_8_;
        uStack_f0 = local_d8._8_8_;
        local_138 = CONCAT44(aaStack_b8[0].mem.nonalias,aaStack_b8[0].mem.alias);
        uStack_130 = aaStack_b8[0].mem.nloc;
        MStack_12c = aaStack_b8[0].mem.base;
        MStack_128 = aaStack_b8[0].mem.index;
        MStack_124 = aaStack_b8[0].mem.disp;
        pgVar26 = (gen_ctx_conflict *)pgVar26->call_ops;
        c2m_ctx_00 = (c2m_ctx_t)(pgVar26->zero_op).mir_op.data;
        if (c2m_ctx_00 == (c2m_ctx_t)0x0) goto LAB_001ab36e;
        pdVar4 = (pgVar26->zero_op).decl;
        uVar16 = 1;
        uVar28 = aaStack_b8[0].reg;
      }
      puVar22 = &pdVar4->field_0x1;
      if (*(undefined1 **)&(pgVar26->zero_op).field_0x8 < puVar22) {
        p_Stack_1e0 = (MIR_error_func_t)0x1ab2fe;
        pvVar23 = realloc(c2m_ctx_00,(long)(puVar22 + ((ulong)puVar22 >> 1)) * 0x30);
        (pgVar26->zero_op).mir_op.data = pvVar23;
        *(undefined1 **)&(pgVar26->zero_op).field_0x8 = puVar22 + ((ulong)puVar22 >> 1);
      }
      pdVar4 = (pgVar26->zero_op).decl;
      pvVar23 = (pgVar26->zero_op).mir_op.data;
      (pgVar26->zero_op).decl = (decl_t)&pdVar4->field_0x1;
      puVar1 = (undefined8 *)((long)pvVar23 + (long)pdVar4 * 0x30);
      *puVar1 = pdStack_e8;
      puVar1[1] = uStack_e0;
      *(undefined4 *)((long)pvVar23 + (long)pdVar4 * 0x30 + 0x10) = uVar28;
      *(ulong *)((long)pvVar23 + (long)pdVar4 * 0x30 + 0x20) = CONCAT44(MStack_128,MStack_12c);
      *(MIR_disp_t *)((long)pvVar23 + (long)pdVar4 * 0x30 + 0x28) = MStack_124;
      *(undefined8 *)((long)pvVar23 + (long)pdVar4 * 0x30 + 0x14) = local_138;
      *(ulong *)((long)pvVar23 + (long)pdVar4 * 0x30 + 0x1c) = CONCAT44(MStack_12c,uStack_130);
    }
    else if (0 < (int)uVar16) {
      uVar27 = 0;
      do {
        MVar17 = local_100[uVar27] & ~MIR_T_I16;
        disp = (gen_ctx *)0x5;
        MVar19 = local_100[uVar27];
        if (MVar17 == MIR_T_U8) {
          MVar19 = MIR_T_U32;
        }
        if (MVar17 == MIR_T_I8) {
          MVar19 = MIR_T_I32;
        }
        p_Stack_1e0 = (MIR_error_func_t)0x1aaf5d;
        ctx = c2m_ctx;
        get_new_temp((op_t *)local_d8,c2m_ctx,MVar19);
        uVar15 = aaStack_b8[0].mem.disp;
        uVar14 = aaStack_b8[0].mem.index;
        uVar13 = aaStack_b8[0].mem.base;
        uVar12 = aaStack_b8[0].mem.nloc;
        uVar28 = aaStack_b8[0].reg;
        pdStack_e8 = (decl_t)CONCAT44(local_d8._20_4_,local_d8._16_4_);
        uStack_e0._4_4_ = local_d8._28_4_;
        uStack_e0._0_4_ = local_d8._24_4_;
        local_f8 = (decl_t)local_d8._0_8_;
        uStack_f0 = local_d8._8_8_;
        uVar10 = CONCAT44(aaStack_b8[0].mem.nonalias,aaStack_b8[0].mem.alias);
        pVVar3 = pgVar26->call_ops;
        c2m_ctx_00 = (c2m_ctx_t)pVVar3->varr;
        if (c2m_ctx_00 == (c2m_ctx_t)0x0) {
          p_Stack_1e0 = (MIR_error_func_t)0x1ab369;
          target_add_call_res_op_cold_1();
          goto LAB_001ab369;
        }
        uVar20 = pVVar3->els_num + 1;
        if (pVVar3->size < uVar20) {
          sVar25 = (uVar20 >> 1) + uVar20;
          p_Stack_1e0 = (MIR_error_func_t)0x1aafd0;
          pMVar21 = (MIR_op_t *)realloc(c2m_ctx_00,sVar25 * 0x30);
          pVVar3->varr = pMVar21;
          pVVar3->size = sVar25;
        }
        sVar25 = pVVar3->els_num;
        pMVar21 = pVVar3->varr;
        pVVar3->els_num = sVar25 + 1;
        pMVar21[sVar25].data = pdStack_e8;
        *(undefined8 *)&pMVar21[sVar25].field_0x8 = uStack_e0;
        pMVar21[sVar25].u.reg = uVar28;
        puVar1 = (undefined8 *)((long)&pMVar21[sVar25].u + 0x10);
        *puVar1 = CONCAT44(uVar14,uVar13);
        puVar1[1] = uVar15;
        puVar1 = (undefined8 *)((long)&pMVar21[sVar25].u.str.len + 4);
        *puVar1 = uVar10;
        puVar1[1] = CONCAT44(uVar13,uVar12);
        uVar27 = uVar27 + 1;
      } while (uVar16 != uVar27);
    }
  }
  return uVar16;
}

Assistant:

static int target_add_call_res_op (c2m_ctx_t c2m_ctx, struct type *ret_type,
                                   target_arg_info_t *arg_info, size_t call_arg_area_offset) {
  gen_ctx_t gen_ctx = c2m_ctx->gen_ctx;
  MIR_context_t ctx = c2m_ctx->ctx;
  MIR_type_t type;
  MIR_type_t qword_types[MAX_QWORDS];
  op_t temp;
  int i, n_qwords;

  if (void_type_p (ret_type)) return -1;
  n_qwords = process_ret_type (c2m_ctx, ret_type, qword_types);
  if (n_qwords != 0) {
    for (i = 0; i < n_qwords; i++) {
      temp = get_new_temp (c2m_ctx, promote_mir_int_type (qword_types[i]));
      VARR_PUSH (MIR_op_t, call_ops, temp.mir_op);
    }
    return n_qwords;
  } else if (ret_type->mode == TM_STRUCT || ret_type->mode == TM_UNION) { /* return by reference */
    arg_info->n_iregs++;
    temp = get_new_temp (c2m_ctx, MIR_T_I64);
    emit3 (c2m_ctx, MIR_ADD, temp.mir_op,
           MIR_new_reg_op (ctx, MIR_reg (ctx, FP_NAME, curr_func->u.func)),
           MIR_new_int_op (ctx, call_arg_area_offset));
    temp.mir_op
      = MIR_new_mem_op (ctx, MIR_T_RBLK, type_size (c2m_ctx, ret_type), temp.mir_op.u.reg, 0, 1);
    VARR_PUSH (MIR_op_t, call_ops, temp.mir_op);
    return 0;
  } else {
    type = get_mir_type (c2m_ctx, ret_type);
    type = promote_mir_int_type (type);
    temp = get_new_temp (c2m_ctx, type);
    VARR_PUSH (MIR_op_t, call_ops, temp.mir_op);
    return 1;
  }
}